

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O3

void __thiscall
Assimp::LWO::AnimResolver::ExtractAnimChannel(AnimResolver *this,aiNodeAnim **out,uint flags)

{
  undefined8 *puVar1;
  float *pfVar2;
  Envelope *pEVar3;
  pointer paVar4;
  aiNodeAnim *paVar5;
  aiVectorKey *paVar6;
  aiQuatKey *paVar7;
  ulong uVar8;
  uint uVar9;
  aiQuatKey *paVar10;
  ulong uVar11;
  aiNodeAnim **ppaVar12;
  long lVar13;
  pointer paVar14;
  size_t sVar15;
  bool bVar16;
  float fVar17;
  undefined4 extraout_XMM0_Db;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> keys;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> local_b8;
  float local_98;
  undefined4 local_80;
  float local_7c;
  undefined8 local_78;
  float local_68;
  float local_58;
  float local_48;
  
  *out = (aiNodeAnim *)0x0;
  if ((((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
       &((_List_node_base *)this->envelopes)->_M_next)->_M_impl)._M_node.super__List_node_base.
      _M_next == (_List_node_base *)this->envelopes) {
    return;
  }
  pEVar3 = this->trans_x;
  if (((pEVar3 == (Envelope *)0x0) ||
      (bVar16 = true,
      (ulong)(((long)(pEVar3->keys).
                     super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(pEVar3->keys).
                     super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 2)) &&
     ((pEVar3 = this->trans_y, pEVar3 == (Envelope *)0x0 ||
      (bVar16 = true,
      (ulong)(((long)(pEVar3->keys).
                     super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(pEVar3->keys).
                     super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 2)))) {
    pEVar3 = this->trans_z;
    if (pEVar3 == (Envelope *)0x0) {
      bVar16 = false;
    }
    else {
      bVar16 = 1 < (ulong)(((long)(pEVar3->keys).
                                  super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pEVar3->keys).
                                  super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x3333333333333333);
    }
  }
  pEVar3 = this->rotat_x;
  ppaVar12 = out;
  if (pEVar3 != (Envelope *)0x0) {
    ppaVar12 = (aiNodeAnim **)CONCAT71((int7)((ulong)out >> 8),1);
    local_98 = SUB84(ppaVar12,0);
    if (1 < (ulong)(((long)(pEVar3->keys).
                           super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pEVar3->keys).
                           super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333))
    goto LAB_00687a1b;
  }
  pEVar3 = this->rotat_y;
  if (pEVar3 != (Envelope *)0x0) {
    ppaVar12 = (aiNodeAnim **)CONCAT71((int7)((ulong)ppaVar12 >> 8),1);
    local_98 = SUB84(ppaVar12,0);
    if (1 < (ulong)(((long)(pEVar3->keys).
                           super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pEVar3->keys).
                           super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333))
    goto LAB_00687a1b;
  }
  pEVar3 = this->rotat_z;
  if (pEVar3 == (Envelope *)0x0) {
    local_98 = 0.0;
  }
  else {
    local_98 = (float)CONCAT71((int7)((ulong)ppaVar12 >> 8),
                               1 < (ulong)(((long)(pEVar3->keys).
                                                  super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(pEVar3->keys).
                                                  super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                          -0x3333333333333333));
  }
LAB_00687a1b:
  pEVar3 = this->scale_x;
  if (((pEVar3 == (Envelope *)0x0) ||
      (local_80 = (undefined4)CONCAT71((int7)((ulong)pEVar3 >> 8),1),
      (ulong)(((long)(pEVar3->keys).
                     super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(pEVar3->keys).
                     super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 2)) &&
     ((pEVar3 = this->scale_y, pEVar3 == (Envelope *)0x0 ||
      (local_80 = (undefined4)CONCAT71((int7)((ulong)pEVar3 >> 8),1),
      (ulong)(((long)(pEVar3->keys).
                     super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(pEVar3->keys).
                     super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 2)))) {
    pEVar3 = this->scale_z;
    if (pEVar3 == (Envelope *)0x0) {
      local_80 = 0;
    }
    else {
      local_80 = (undefined4)
                 CONCAT71((int7)((ulong)pEVar3 >> 8),
                          1 < (ulong)(((long)(pEVar3->keys).
                                             super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(pEVar3->keys).
                                             super__Vector_base<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x3333333333333333));
    }
    if ((!bVar16 && SUB41(local_98,0) == '\0') && ((char)local_80 == '\0')) {
      return;
    }
  }
  paVar5 = (aiNodeAnim *)operator_new(0x438);
  (paVar5->mNodeName).length = 0;
  (paVar5->mNodeName).data[0] = '\0';
  memset((paVar5->mNodeName).data + 1,0x1b,0x3ff);
  paVar5->mRotationKeys = (aiQuatKey *)0x0;
  paVar5->mNumScalingKeys = 0;
  *(undefined8 *)&paVar5->mNumPositionKeys = 0;
  *(undefined8 *)((long)&paVar5->mPositionKeys + 4) = 0;
  paVar5->mScalingKeys = (aiVectorKey *)0x0;
  paVar5->mPreState = aiAnimBehaviour_DEFAULT;
  paVar5->mPostState = aiAnimBehaviour_DEFAULT;
  *out = paVar5;
  if (this->need_to_setup == true) {
    UpdateAnimRangeSetup(this);
    this->need_to_setup = false;
  }
  if (bVar16) {
    local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68 = (float)flags;
    GetKeys(this,&local_b8,this->trans_x,this->trans_y,this->trans_z,flags);
    paVar14 = local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_78 = local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
               super__Vector_impl_data._M_finish;
    sVar15 = (long)local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar9 = (int)((long)sVar15 >> 3) * -0x55555555;
    paVar5->mNumPositionKeys = uVar9;
    uVar11 = (ulong)uVar9 * 0x18;
    paVar6 = (aiVectorKey *)operator_new__(uVar11);
    if ((ulong)uVar9 != 0) {
      uVar8 = 0;
      do {
        puVar1 = (undefined8 *)((long)&paVar6->mTime + uVar8);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)&(paVar6->mValue).z + uVar8) = 0;
        uVar8 = uVar8 + 0x18;
      } while (uVar11 != uVar8);
    }
    paVar5->mPositionKeys = paVar6;
    if (local_78 != paVar14) {
      memmove(paVar6,paVar14,sVar15);
    }
    flags = (uint)local_68;
    if (paVar14 != (pointer)0x0) {
      operator_delete(paVar14,(long)local_b8.
                                    super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)paVar14);
      flags = (uint)local_68;
    }
  }
  if (local_98._0_1_ != '\0') {
    local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetKeys(this,&local_b8,this->rotat_x,this->rotat_y,this->rotat_z,flags);
    paVar14 = local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar11 = ((long)local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    uVar9 = (uint)uVar11;
    paVar5->mNumRotationKeys = uVar9;
    uVar11 = uVar11 & 0xffffffff;
    paVar7 = (aiQuatKey *)operator_new__(uVar11 * 0x18);
    if (uVar11 != 0) {
      paVar10 = paVar7;
      do {
        paVar10->mTime = 0.0;
        (paVar10->mValue).w = 1.0;
        (paVar10->mValue).x = 0.0;
        (paVar10->mValue).y = 0.0;
        (paVar10->mValue).z = 0.0;
        paVar10 = paVar10 + 1;
      } while (paVar10 != paVar7 + uVar11);
    }
    paVar5->mRotationKeys = paVar7;
    if (uVar9 != 0) {
      lVar13 = 0;
      uVar11 = 0;
      do {
        paVar7 = paVar5->mRotationKeys;
        *(undefined8 *)((long)&paVar7->mTime + lVar13) =
             *(undefined8 *)
              ((long)&(local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                       _M_impl.super__Vector_impl_data._M_start)->mTime + lVar13);
        local_98 = *(float *)((long)&((local_b8.
                                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->mValue).x +
                             lVar13) * 0.5;
        fVar17 = sinf(local_98);
        local_78 = (pointer)CONCAT44(extraout_XMM0_Db,fVar17);
        local_68 = cosf(local_98);
        local_98 = *(float *)((long)&((local_b8.
                                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->mValue).y +
                             lVar13) * 0.5;
        local_58 = sinf(local_98);
        local_48 = cosf(local_98);
        local_7c = *(float *)((long)&((local_b8.
                                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->mValue).z +
                             lVar13) * 0.5;
        local_98 = sinf(local_7c);
        fVar17 = cosf(local_7c);
        fVar22 = (float)local_78 * 0.0;
        fVar23 = local_58 * 0.0;
        fVar21 = local_98 * 0.0;
        fVar20 = ((local_68 * local_48 - local_58 * fVar22) - (float)local_78 * fVar23) -
                 fVar22 * fVar23;
        fVar18 = (local_58 * fVar22 + fVar23 * local_68 + local_48 * (float)local_78) -
                 fVar22 * fVar23;
        fVar19 = ((float)local_78 * fVar23 + local_58 * local_68 + local_48 * fVar22) -
                 fVar22 * fVar23;
        fVar22 = (fVar23 * local_68 + local_48 * fVar22 + fVar22 * fVar23) -
                 (float)local_78 * local_58;
        pfVar2 = (float *)((long)&(paVar7->mValue).w + lVar13);
        *pfVar2 = (-fVar18 * fVar21 + fVar17 * fVar20 + -fVar19 * fVar21) - fVar22 * local_98;
        pfVar2[1] = (fVar18 * local_98 + fVar21 * fVar20 + fVar19 * fVar17) - fVar22 * fVar21;
        pfVar2[2] = (fVar21 * fVar22 + fVar18 * fVar17 + fVar20 * fVar21) - local_98 * fVar19;
        pfVar2[3] = (fVar21 * fVar19 + fVar22 * fVar17 + fVar20 * local_98) - fVar21 * fVar18;
        uVar11 = uVar11 + 1;
        lVar13 = lVar13 + 0x18;
        paVar14 = local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar11 < paVar5->mNumRotationKeys);
    }
    if (paVar14 != (pointer)0x0) {
      operator_delete(paVar14,(long)local_b8.
                                    super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)paVar14);
    }
  }
  if ((char)local_80 != '\0') {
    local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetKeys(this,&local_b8,this->scale_x,this->scale_y,this->scale_z,flags);
    paVar4 = local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
             super__Vector_impl_data._M_finish;
    paVar14 = local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar15 = (long)local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_b8.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar8 = ((long)sVar15 >> 3) * -0x5555555555555555;
    paVar5->mNumScalingKeys = (uint)uVar8;
    uVar8 = uVar8 & 0xffffffff;
    uVar11 = uVar8 * 0x18;
    paVar6 = (aiVectorKey *)operator_new__(uVar11);
    if (uVar8 != 0) {
      uVar8 = 0;
      do {
        puVar1 = (undefined8 *)((long)&paVar6->mTime + uVar8);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)&(paVar6->mValue).z + uVar8) = 0;
        uVar8 = uVar8 + 0x18;
      } while (uVar11 != uVar8);
    }
    paVar5->mScalingKeys = paVar6;
    if (paVar4 != paVar14) {
      memmove(paVar6,paVar14,sVar15);
    }
    if (paVar14 != (pointer)0x0) {
      operator_delete(paVar14,(long)local_b8.
                                    super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)paVar14);
    }
  }
  return;
}

Assistant:

void AnimResolver::ExtractAnimChannel(aiNodeAnim** out, unsigned int flags /*= 0*/)
{
    *out = NULL;


    //FIXME: crashes if more than one component is animated at different timings, to be resolved.

    // If we have no envelopes, return NULL
    if (envelopes.empty()) {
        return;
    }

    // We won't spawn an animation channel if we don't have at least one envelope with more than one keyframe defined.
    const bool trans = ((trans_x && trans_x->keys.size() > 1) || (trans_y && trans_y->keys.size() > 1) || (trans_z && trans_z->keys.size() > 1));
    const bool rotat = ((rotat_x && rotat_x->keys.size() > 1) || (rotat_y && rotat_y->keys.size() > 1) || (rotat_z && rotat_z->keys.size() > 1));
    const bool scale = ((scale_x && scale_x->keys.size() > 1) || (scale_y && scale_y->keys.size() > 1) || (scale_z && scale_z->keys.size() > 1));
    if (!trans && !rotat && !scale)
        return;

    // Allocate the output animation
    aiNodeAnim* anim = *out = new aiNodeAnim();

    // Setup default animation setup if necessary
    if (need_to_setup) {
        UpdateAnimRangeSetup();
        need_to_setup = false;
    }

    // copy translation keys
    if (trans) {
        std::vector<aiVectorKey> keys;
        GetKeys(keys,trans_x,trans_y,trans_z,flags);

        anim->mPositionKeys = new aiVectorKey[ anim->mNumPositionKeys = static_cast<unsigned int>(keys.size()) ];
        std::copy(keys.begin(),keys.end(),anim->mPositionKeys);
    }

    // copy rotation keys
    if (rotat) {
        std::vector<aiVectorKey> keys;
        GetKeys(keys,rotat_x,rotat_y,rotat_z,flags);

        anim->mRotationKeys = new aiQuatKey[ anim->mNumRotationKeys = static_cast<unsigned int>(keys.size()) ];

        // convert heading, pitch, bank to quaternion
        // mValue.x=Heading=Rot(Y), mValue.y=Pitch=Rot(X), mValue.z=Bank=Rot(Z)
        // Lightwave's rotation order is ZXY
        aiVector3D X(1.0,0.0,0.0);
        aiVector3D Y(0.0,1.0,0.0);
        aiVector3D Z(0.0,0.0,1.0);
        for (unsigned int i = 0; i < anim->mNumRotationKeys; ++i) {
            aiQuatKey& qk = anim->mRotationKeys[i];
            qk.mTime  = keys[i].mTime;
            qk.mValue = aiQuaternion(Y,keys[i].mValue.x)*aiQuaternion(X,keys[i].mValue.y)*aiQuaternion(Z,keys[i].mValue.z);
        }
    }

    // copy scaling keys
    if (scale) {
        std::vector<aiVectorKey> keys;
        GetKeys(keys,scale_x,scale_y,scale_z,flags);

        anim->mScalingKeys = new aiVectorKey[ anim->mNumScalingKeys = static_cast<unsigned int>(keys.size()) ];
        std::copy(keys.begin(),keys.end(),anim->mScalingKeys);
    }
}